

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

int lj_ir_numcmp(lua_Number a,lua_Number b,IROp op)

{
  IROp op_local;
  lua_Number b_local;
  lua_Number a_local;
  uint local_4;
  
  switch(op) {
  case IR_LT:
    local_4 = (uint)(a < b);
    break;
  case IR_GE:
    local_4 = (uint)(b <= a);
    break;
  case IR_LE:
    local_4 = (uint)(a <= b);
    break;
  case IR_GT:
    local_4 = (uint)(b < a);
    break;
  case IR_ULT:
    local_4 = (uint)((b <= a ^ 0xffU) & 1);
    break;
  case IR_UGE:
    local_4 = (uint)((a < b ^ 0xffU) & 1);
    break;
  case IR_ULE:
    local_4 = (uint)((b < a ^ 0xffU) & 1);
    break;
  case IR_UGT:
    local_4 = (uint)((a <= b ^ 0xffU) & 1);
    break;
  case IR_EQ:
    local_4 = (uint)(a == b);
    break;
  case IR_NE:
    local_4 = (uint)(a != b);
    break;
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int lj_ir_numcmp(lua_Number a, lua_Number b, IROp op)
{
  switch (op) {
  case IR_EQ: return (a == b);
  case IR_NE: return (a != b);
  case IR_LT: return (a < b);
  case IR_GE: return (a >= b);
  case IR_LE: return (a <= b);
  case IR_GT: return (a > b);
  case IR_ULT: return !(a >= b);
  case IR_UGE: return !(a < b);
  case IR_ULE: return !(a > b);
  case IR_UGT: return !(a <= b);
  default: lj_assertX(0, "bad IR op %d", op); return 0;
  }
}